

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O2

void __thiscall
BamTools::ConvertTool::ConvertToolPrivate::PrintSam(ConvertToolPrivate *this,BamAlignment *a)

{
  ostream *this_00;
  char cVar1;
  int iVar2;
  pointer pRVar3;
  pointer pCVar4;
  pointer pcVar5;
  ulong uVar6;
  bool bVar7;
  ostream *poVar8;
  char *pcVar9;
  const_iterator cigarIter;
  pointer pCVar10;
  ulong uVar11;
  ulong uVar12;
  string tagName;
  
  this_00 = &this->m_out;
  poVar8 = std::operator<<(this_00,(string *)a);
  poVar8 = std::operator<<(poVar8,'\t');
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::operator<<(poVar8,'\t');
  iVar2 = a->RefID;
  if (((long)iVar2 < 0) ||
     (pRVar3 = (this->m_references).
               super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl.
               super__Vector_impl_data._M_start,
     (int)(((long)(this->m_references).
                  super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pRVar3) / 0x28) <= iVar2)) {
    std::operator<<(this_00,"*\t");
  }
  else {
    poVar8 = std::operator<<(this_00,(string *)(pRVar3 + iVar2));
    std::operator<<(poVar8,'\t');
  }
  poVar8 = (ostream *)std::ostream::operator<<(this_00,a->Position + 1);
  poVar8 = std::operator<<(poVar8,'\t');
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,a->MapQuality);
  std::operator<<(poVar8,'\t');
  pCVar10 = (a->CigarData).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pCVar4 = (a->CigarData).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pCVar10 == pCVar4) {
    std::operator<<(this_00,"*\t");
  }
  else {
    for (; pCVar10 != pCVar4; pCVar10 = pCVar10 + 1) {
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::operator<<(poVar8,pCVar10->Type);
    }
    std::operator<<(this_00,'\t');
  }
  bVar7 = BamAlignment::IsPaired(a);
  if (bVar7) {
    iVar2 = a->MateRefID;
    if (((long)iVar2 < 0) ||
       (pRVar3 = (this->m_references).
                 super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl.
                 super__Vector_impl_data._M_start,
       (int)(((long)(this->m_references).
                    super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pRVar3) / 0x28) <= iVar2))
    goto LAB_00164661;
    if (iVar2 == a->RefID) {
      std::operator<<(this_00,"=\t");
    }
    else {
      poVar8 = std::operator<<(this_00,(string *)(pRVar3 + iVar2));
      std::operator<<(poVar8,'\t');
    }
    poVar8 = (ostream *)std::ostream::operator<<(this_00,a->MatePosition + 1);
    poVar8 = std::operator<<(poVar8,'\t');
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,a->InsertSize);
    std::operator<<(poVar8,'\t');
  }
  else {
LAB_00164661:
    std::operator<<(this_00,"*\t0\t0\t");
  }
  if ((a->QueryBases)._M_string_length == 0) {
    std::operator<<(this_00,"*\t");
  }
  else {
    poVar8 = std::operator<<(this_00,(string *)&a->QueryBases);
    std::operator<<(poVar8,'\t');
  }
  if ((a->Qualities)._M_string_length != 0) {
    pcVar9 = (char *)std::__cxx11::string::at((ulong)&a->Qualities);
    if (*pcVar9 != -1) {
      std::operator<<(this_00,(string *)&a->Qualities);
      goto LAB_001646d1;
    }
  }
  std::operator<<(this_00,'*');
LAB_001646d1:
  pcVar5 = (a->TagData)._M_dataplus._M_p;
  uVar6 = (a->TagData)._M_string_length;
  uVar11 = 0;
  do {
    if (uVar6 <= uVar11) break;
    std::__cxx11::string::substr((ulong)&tagName,(ulong)&a->TagData);
    poVar8 = std::operator<<(this_00,'\t');
    poVar8 = std::operator<<(poVar8,(string *)&tagName);
    std::operator<<(poVar8,':');
    pcVar9 = (char *)std::__cxx11::string::at((ulong)&a->TagData);
    cVar1 = *pcVar9;
    uVar12 = uVar11 + 3;
    switch(cVar1) {
    case 'A':
      poVar8 = std::operator<<(this_00,"A:");
      std::operator<<(poVar8,pcVar5[uVar12]);
      goto LAB_0016486a;
    case 'B':
    case 'D':
    case 'E':
    case 'F':
    case 'G':
      break;
    case 'C':
      poVar8 = std::operator<<(this_00,"i:");
      std::ostream::operator<<(poVar8,(short)pcVar5[uVar12]);
LAB_0016486a:
      uVar12 = uVar11 + 4;
      break;
    case 'H':
switchD_001647ac_caseD_48:
      poVar8 = std::operator<<(this_00,cVar1);
      std::operator<<(poVar8,':');
      for (uVar12 = uVar11 + 4; pcVar5[uVar12 - 1] != '\0'; uVar12 = uVar12 + 1) {
        std::operator<<(this_00,pcVar5[uVar12 - 1]);
      }
      break;
    case 'I':
      poVar8 = std::operator<<(this_00,"i:");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
LAB_001648ac:
      uVar12 = uVar11 + 7;
      break;
    default:
      if (cVar1 != 'S') {
        if (cVar1 == 'Z') goto switchD_001647ac_caseD_48;
        if (cVar1 != 'c') {
          if (cVar1 == 'f') {
            poVar8 = std::operator<<(this_00,"f:");
            std::ostream::operator<<(poVar8,*(float *)(pcVar5 + uVar12));
          }
          else {
            if (cVar1 != 'i') {
              if (cVar1 != 's') break;
              poVar8 = std::operator<<(this_00,"i:");
              std::ostream::operator<<(poVar8,*(short *)(pcVar5 + uVar12));
              goto LAB_001648cf;
            }
            poVar8 = std::operator<<(this_00,"i:");
            std::ostream::operator<<(poVar8,*(int *)(pcVar5 + uVar12));
          }
          goto LAB_001648ac;
        }
        poVar8 = std::operator<<(this_00,"i:");
        std::ostream::operator<<(poVar8,(short)pcVar5[uVar12]);
        goto LAB_0016486a;
      }
      poVar8 = std::operator<<(this_00,"i:");
      std::ostream::operator<<(poVar8,*(ushort *)(pcVar5 + uVar12));
LAB_001648cf:
      uVar12 = uVar11 + 5;
    }
    cVar1 = pcVar5[uVar12];
    std::__cxx11::string::~string((string *)&tagName);
    uVar11 = uVar12;
  } while (cVar1 != '\0');
  std::endl<char,std::char_traits<char>>(this_00);
  return;
}

Assistant:

void ConvertTool::ConvertToolPrivate::PrintSam(const BamAlignment& a)
{

    // tab-delimited
    // <QNAME> <FLAG> <RNAME> <POS> <MAPQ> <CIGAR> <MRNM> <MPOS> <ISIZE> <SEQ> <QUAL> [ <TAG>:<VTYPE>:<VALUE> [...] ]

    // write name & alignment flag
    m_out << a.Name << '\t' << a.AlignmentFlag << '\t';

    // write reference name
    if ((a.RefID >= 0) && (a.RefID < (int)m_references.size()))
        m_out << m_references[a.RefID].RefName << '\t';
    else
        m_out << "*\t";

    // write position & map quality
    m_out << a.Position + 1 << '\t' << a.MapQuality << '\t';

    // write CIGAR
    const std::vector<CigarOp>& cigarData = a.CigarData;
    if (cigarData.empty())
        m_out << "*\t";
    else {
        std::vector<CigarOp>::const_iterator cigarIter = cigarData.begin();
        std::vector<CigarOp>::const_iterator cigarEnd = cigarData.end();
        for (; cigarIter != cigarEnd; ++cigarIter) {
            const CigarOp& op = (*cigarIter);
            m_out << op.Length << op.Type;
        }
        m_out << '\t';
    }

    // write mate reference name, mate position, & insert size
    if (a.IsPaired() && (a.MateRefID >= 0) && (a.MateRefID < (int)m_references.size())) {
        if (a.MateRefID == a.RefID)
            m_out << "=\t";
        else
            m_out << m_references[a.MateRefID].RefName << '\t';
        m_out << a.MatePosition + 1 << '\t' << a.InsertSize << '\t';
    } else
        m_out << "*\t0\t0\t";

    // write sequence
    if (a.QueryBases.empty())
        m_out << "*\t";
    else
        m_out << a.QueryBases << '\t';

    // write qualities
    if (a.Qualities.empty() || (a.Qualities.at(0) == (char)0xFF))
        m_out << '*';
    else
        m_out << a.Qualities;

    // write tag data
    const char* tagData = a.TagData.c_str();
    const std::size_t tagDataLength = a.TagData.length();

    std::size_t index = 0;
    while (index < tagDataLength) {

        // write tag name
        std::string tagName = a.TagData.substr(index, 2);
        m_out << '\t' << tagName << ':';
        index += 2;

        // get data type
        char type = a.TagData.at(index);
        ++index;
        switch (type) {
            case (Constants::BAM_TAG_TYPE_ASCII):
                m_out << "A:" << tagData[index];
                ++index;
                break;

            case (Constants::BAM_TAG_TYPE_INT8):
                // force value into integer-type (instead of char value)
                m_out << "i:" << static_cast<int16_t>(tagData[index]);
                ++index;
                break;

            case (Constants::BAM_TAG_TYPE_UINT8):
                // force value into integer-type (instead of char value)
                m_out << "i:" << static_cast<uint16_t>(tagData[index]);
                ++index;
                break;

            case (Constants::BAM_TAG_TYPE_INT16):
                m_out << "i:" << BamTools::UnpackSignedShort(&tagData[index]);
                index += sizeof(int16_t);
                break;

            case (Constants::BAM_TAG_TYPE_UINT16):
                m_out << "i:" << BamTools::UnpackUnsignedShort(&tagData[index]);
                index += sizeof(uint16_t);
                break;

            case (Constants::BAM_TAG_TYPE_INT32):
                m_out << "i:" << BamTools::UnpackSignedInt(&tagData[index]);
                index += sizeof(int32_t);
                break;

            case (Constants::BAM_TAG_TYPE_UINT32):
                m_out << "i:" << BamTools::UnpackUnsignedInt(&tagData[index]);
                index += sizeof(uint32_t);
                break;

            case (Constants::BAM_TAG_TYPE_FLOAT):
                m_out << "f:" << BamTools::UnpackFloat(&tagData[index]);
                index += sizeof(float);
                break;

            case (Constants::BAM_TAG_TYPE_HEX):  // fall-through
            case (Constants::BAM_TAG_TYPE_STRING):
                m_out << type << ':';
                while (tagData[index]) {
                    m_out << tagData[index];
                    ++index;
                }
                ++index;
                break;
        }

        if (tagData[index] == '\0') break;
    }

    m_out << std::endl;
}